

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall github111116::ConsoleLogger::warn<char_const*>(ConsoleLogger *this,char **args)

{
  ConsoleLogger *in_RSI;
  char **in_RDI;
  
  if (*(int *)((long)in_RDI + 0x6c) < 3) {
    std::mutex::lock((mutex *)in_RSI);
    if (((ulong)in_RDI[0xd] & 1) != 0) {
      std::operator<<((ostream *)*in_RDI,(string *)(in_RDI + 5));
    }
    std::operator<<((ostream *)*in_RDI,"[!] ");
    print<char_const*>(in_RSI,in_RDI);
    if (((ulong)in_RDI[0xd] & 1) != 0) {
      std::operator<<((ostream *)*in_RDI,"\x1b[0m");
    }
    std::mutex::unlock((mutex *)0x194577);
  }
  return;
}

Assistant:

void ConsoleLogger::warn(const Args&... args)
{
	if (loglevel > 2) return;
	mtx.lock();
	if (colored) out << warnColor;
	out << "[!] ";
	print(args...);
	if (colored) out << "\033[0m";
	mtx.unlock();
}